

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O1

IVideoDriver * irr::video::createNullDriver(IFileSystem *io,dimension2d<unsigned_int> *screenSize)

{
  int *piVar1;
  long lVar2;
  CNullDriver *this;
  long *plVar3;
  int iVar4;
  
  this = (CNullDriver *)operator_new(0x4a8);
  CNullDriver::CNullDriver(this,io,screenSize);
  iVar4 = 5;
  do {
    plVar3 = (long *)operator_new(0x20);
    plVar3[2] = 0;
    plVar3[3] = 0;
    *plVar3 = 0;
    plVar3[1] = 0;
    plVar3[2] = 0;
    *(undefined4 *)(plVar3 + 3) = 1;
    *plVar3 = (long)&PTR_OnSetMaterial_00266728;
    plVar3[1] = (long)&PTR__IMaterialRenderer_00266780;
    (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x4d])(this,plVar3,0);
    lVar2 = *(long *)(*plVar3 + -0x18);
    piVar1 = (int *)((long)plVar3 + lVar2 + 0x10);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      plVar3 = (long *)((long)plVar3 + lVar2);
      (**(code **)(*plVar3 + 8))(plVar3);
    }
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  return &this->super_IVideoDriver;
}

Assistant:

IVideoDriver *createNullDriver(io::IFileSystem *io, const core::dimension2d<u32> &screenSize)
{
	CNullDriver *nullDriver = new CNullDriver(io, screenSize);

	// create empty material renderers
	for (u32 i = 0; sBuiltInMaterialTypeNames[i]; ++i) {
		IMaterialRenderer *imr = new IMaterialRenderer();
		nullDriver->addMaterialRenderer(imr);
		imr->drop();
	}

	return nullDriver;
}